

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MetricsDiscoveryHelper.cpp
# Opt level: O2

void __thiscall
MetricsDiscovery::MDHelper::OpenStream
          (MDHelper *this,uint32_t timerPeriod,uint32_t bufferSize,uint32_t pid)

{
  int iVar1;
  long lVar2;
  IMetricSetLatest *pIVar3;
  IConcurrentGroupLatest *pIVar4;
  uint32_t local_34;
  uint32_t timerPeriod_local;
  uint32_t numReports;
  vector<char,_std::allocator<char>_> reportData;
  
  if ((((this->m_Initialized == true) &&
       (pIVar4 = this->m_ConcurrentGroup, pIVar4 != (IConcurrentGroupLatest *)0x0)) &&
      (pIVar3 = this->m_MetricSet, pIVar3 != (IMetricSetLatest *)0x0)) &&
     ((this->m_APIMask & 1) != 0)) {
    local_34 = bufferSize;
    timerPeriod_local = timerPeriod;
    if (bufferSize == 0) {
      lVar2 = (**(code **)(*(long *)this->m_MetricsDevice + 0x28))
                        (this->m_MetricsDevice,"OABufferMaxSize");
      if (lVar2 == 0) {
        local_34 = 0x400000;
      }
      else {
        local_34 = *(uint32_t *)(lVar2 + 8);
      }
      pIVar4 = this->m_ConcurrentGroup;
      pIVar3 = this->m_MetricSet;
    }
    iVar1 = (**(code **)(*(long *)pIVar4 + 0x20))(pIVar4,pIVar3,pid,&timerPeriod_local,&local_34);
    if (iVar1 == 0) {
      lVar2 = (**(code **)(*(long *)this->m_MetricSet + 0x10))();
      reportData.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      reportData.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      reportData.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      std::vector<char,_std::allocator<char>_>::resize(&reportData,(ulong)*(uint *)(lVar2 + 0x18));
      numReports = 1;
      (**(code **)(*(long *)this->m_ConcurrentGroup + 0x28))
                (this->m_ConcurrentGroup,&numReports,
                 reportData.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start,1);
      std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                (&reportData.super__Vector_base<char,_std::allocator<char>_>);
    }
  }
  return;
}

Assistant:

void MDHelper::OpenStream( uint32_t timerPeriod, uint32_t bufferSize, uint32_t pid )
{
    if( !m_Initialized || !m_ConcurrentGroup || !m_MetricSet )
    {
        DebugPrint("Can't OpenStream!\n");
        return;
    }

    if( !( m_APIMask & API_TYPE_IOSTREAM ) )
    {
        DebugPrint("OpenStream requires API_TYPE_IOSTREAM!\n");
        return;
    }

    if( bufferSize == 0 )
    {
        TTypedValueLatest* oaBufferSize = m_MetricsDevice->
            GetGlobalSymbolValueByName( "OABufferMaxSize" );
        if( oaBufferSize )
        {
            bufferSize = oaBufferSize->ValueUInt32;
            DebugPrint("Trying device maximum buffer size = %u bytes.\n", bufferSize);
        }
        else
        {
            bufferSize = 4 * 1024 * 1024;   // 4MB
            DebugPrint("Trying default maximum buffer size = %u bytes.\n", bufferSize);
        }
    }

    TCompletionCode res = m_ConcurrentGroup->OpenIoStream(
        m_MetricSet,
        pid,
        &timerPeriod,
        &bufferSize );
    if( res != CC_OK )
    {
        DebugPrint("OpenIoStream failed %d\n", res);
        return;
    }
    else
    {
        DebugPrint("OpenIoStream succeeded: timer period = %u ns, buffer size = %u bytes.\n",
            timerPeriod,
            bufferSize);
    }

    // Read a dummy report from the stream, to populate the metric names and units.
    const uint32_t  reportSize = m_MetricSet->GetParams()->RawReportSize;

    std::vector<char>   reportData;
    reportData.resize( reportSize );

    uint32_t    numReports = 1;
    res = m_ConcurrentGroup->ReadIoStream(
        &numReports,
        reportData.data(),
        IO_READ_FLAG_DROP_OLD_REPORTS );
    if( res != CC_OK && res != CC_READ_PENDING )
    {
        DebugPrint("Dummy ReadIoStream failed %d\n", res);
        return;
    }
}